

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotation::~IfcAnnotation(IfcAnnotation *this,void **vtt)

{
  void **vtt_local;
  IfcAnnotation *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotation,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotation,_0UL> *)
             &(this->super_IfcProduct).field_0x100,vtt + 0x17);
  IfcProduct::~IfcProduct(&this->super_IfcProduct,vtt + 1);
  return;
}

Assistant:

IfcAnnotation() : Object("IfcAnnotation") {}